

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O2

int Abc_NtkMinimumBase2(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    for (iVar3 = 0; iVar1 = pNtk->vObjs->nSize, iVar3 < iVar1; iVar3 = iVar3 + 1) {
      pAVar2 = Abc_NtkObj(pNtk,iVar3);
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        (pAVar2->vFanouts).nSize = 0;
      }
    }
    iVar3 = 0;
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      pAVar2 = Abc_NtkObj(pNtk,iVar5);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        iVar1 = Abc_NodeMinimumBase2(pAVar2);
        iVar3 = iVar3 + iVar1;
      }
      iVar1 = pNtk->vObjs->nSize;
    }
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      pAVar2 = Abc_NtkObj(pNtk,iVar5);
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        for (lVar4 = 0; lVar4 < (pAVar2->vFanins).nSize; lVar4 = lVar4 + 1) {
          Vec_IntPush((Vec_Int_t *)
                      ((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar4]] + 0x28),
                      pAVar2->Id);
        }
      }
      iVar1 = pNtk->vObjs->nSize;
    }
    return iVar3;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                ,0x5f,"int Abc_NtkMinimumBase2(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkMinimumBase2( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    int i, k, Counter;
    assert( Abc_NtkIsBddLogic(pNtk) );
    // remove all fanouts
    Abc_NtkForEachObj( pNtk, pNode, i )
        Vec_IntClear( &pNode->vFanouts );
    // add useful fanins
    Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += Abc_NodeMinimumBase2( pNode );
    // add fanouts
    Abc_NtkForEachObj( pNtk, pNode, i )
        Abc_ObjForEachFanin( pNode, pFanin, k )
            Vec_IntPush( &pFanin->vFanouts, Abc_ObjId(pNode) );
    return Counter;
}